

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase *
EvaluateFunctionContextAccess(ExpressionEvalContext *ctx,ExprFunctionContextAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *pEVar5;
  undefined4 extraout_var_00;
  TypeBase *pTVar6;
  _func_int **pp_Var7;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      target = FindVariableStorage(ctx,expression->contextVariable,false);
      if (target == (ExprPointerLiteral *)0x0) {
        return (ExprBase *)0x0;
      }
      pTVar6 = expression->function->contextType;
      if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
        pTVar6 = (TypeBase *)0x0;
      }
      if (pTVar6 == (TypeBase *)0x0) {
        __assert_fail("refType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x766,
                      "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                     );
      }
      pp_Var7 = pTVar6[1]._vptr_TypeBase;
      if ((pp_Var7 == (_func_int **)0x0) || (*(int *)(pp_Var7 + 1) != 0x18)) {
        pp_Var7 = (_func_int **)0x0;
      }
      if (pp_Var7 == (_func_int **)0x0) {
        __assert_fail("classType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x76a,
                      "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                     );
      }
      if (pp_Var7[0xd] == (_func_int *)0x0) {
        pAVar2 = ctx->ctx->allocator;
        iVar4 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar6 = expression->function->contextType;
        pEVar5->typeID = 9;
        pEVar5->source = pSVar3;
        pEVar5->type = pTVar6;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f65c8;
      }
      else {
        pEVar5 = CreateLoad(ctx,&target->super_ExprBase);
      }
      if (pEVar5 != (ExprBase *)0x0) {
        pEVar5 = CheckType(&expression->super_ExprBase,pEVar5);
        return pEVar5;
      }
    }
    else {
      Report(ctx,"ERROR: instruction limit reached");
    }
    pEVar5 = (ExprBase *)0x0;
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar4 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar6 = ctx->ctx->typeVoid;
    pEVar5->typeID = 2;
    pEVar5->source = pSVar3;
    pEVar5->type = pTVar6;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
  }
  return pEVar5;
}

Assistant:

ExprBase* EvaluateFunctionContextAccess(ExpressionEvalContext &ctx, ExprFunctionContextAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->contextVariable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = NULL;

	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->members.empty())
		value = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->function->contextType);
	else
		value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}